

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegWriterFlush(Fts3Table *p,SegmentWriter *pWriter,sqlite3_int64 iLevel,int iIdx)

{
  int iVar1;
  uint in_ECX;
  undefined8 in_RDX;
  long *in_RSI;
  Fts3Table *in_RDI;
  long in_FS_OFFSET;
  Fts3Table *unaff_retaddr;
  char *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int *in_stack_00000018;
  sqlite3_int64 iLastLeaf;
  int rc;
  int nRoot;
  char *zRoot;
  sqlite3_int64 iLast;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  sqlite3_int64 in_stack_ffffffffffffffb8;
  long iLeafEndBlock;
  int iIdx_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  sqlite3_int64 iLeaf;
  int iHeight;
  SegmentNode *pTree;
  
  iIdx_00 = (int)((ulong)in_RDX >> 0x20);
  pTree = *(SegmentNode **)(in_FS_OFFSET + 0x28);
  if (*in_RSI == 0) {
    iVar1 = fts3WriteSegdir(in_RDI,(sqlite3_int64)in_RSI,iIdx_00,CONCAT44(in_ECX,0xaaaaaaaa),
                            in_stack_ffffffffffffffb8,
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (sqlite3_int64)unaff_retaddr,in_stack_00000008,in_stack_00000010);
  }
  else {
    iHeight = 0;
    iLeaf = 0;
    uVar2 = 0;
    iLeafEndBlock = in_RSI[2];
    in_RSI[2] = in_RSI[2] + 1;
    iVar1 = fts3WriteSegment((Fts3Table *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa0,
                             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (iVar1 == 0) {
      iVar1 = fts3NodeWrite(unaff_retaddr,pTree,iHeight,iLeaf,
                            CONCAT44(uVar2,in_stack_ffffffffffffffe0),(sqlite3_int64 *)in_RDI,
                            (char **)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000018
                           );
    }
    if (iVar1 == 0) {
      iVar1 = fts3WriteSegdir(in_RDI,(sqlite3_int64)in_RSI,iIdx_00,(ulong)in_ECX << 0x20,
                              iLeafEndBlock,
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (sqlite3_int64)unaff_retaddr,in_stack_00000008,in_stack_00000010);
    }
  }
  in_RDI->nLeafAdd = in_RDI->nLeafAdd + 1;
  if (*(SegmentNode **)(in_FS_OFFSET + 0x28) != pTree) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int fts3SegWriterFlush(
  Fts3Table *p,                   /* Virtual table handle */
  SegmentWriter *pWriter,         /* SegmentWriter to flush to the db */
  sqlite3_int64 iLevel,           /* Value for 'level' column of %_segdir */
  int iIdx                        /* Value for 'idx' column of %_segdir */
){
  int rc;                         /* Return code */
  if( pWriter->pTree ){
    sqlite3_int64 iLast = 0;      /* Largest block id written to database */
    sqlite3_int64 iLastLeaf;      /* Largest leaf block id written to db */
    char *zRoot = NULL;           /* Pointer to buffer containing root node */
    int nRoot = 0;                /* Size of buffer zRoot */

    iLastLeaf = pWriter->iFree;
    rc = fts3WriteSegment(p, pWriter->iFree++, pWriter->aData, pWriter->nData);
    if( rc==SQLITE_OK ){
      rc = fts3NodeWrite(p, pWriter->pTree, 1,
          pWriter->iFirst, pWriter->iFree, &iLast, &zRoot, &nRoot);
    }
    if( rc==SQLITE_OK ){
      rc = fts3WriteSegdir(p, iLevel, iIdx,
          pWriter->iFirst, iLastLeaf, iLast, pWriter->nLeafData, zRoot, nRoot);
    }
  }else{
    /* The entire tree fits on the root node. Write it to the segdir table. */
    rc = fts3WriteSegdir(p, iLevel, iIdx,
        0, 0, 0, pWriter->nLeafData, pWriter->aData, pWriter->nData);
  }
  p->nLeafAdd++;
  return rc;
}